

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_WriteProperties(CLzmaEncHandle pp,Byte *props,SizeT *size)

{
  byte bVar1;
  UInt32 kDictMask;
  UInt32 dictSize;
  uint i;
  CLzmaEnc *p;
  SizeT *size_local;
  Byte *props_local;
  CLzmaEncHandle pp_local;
  SRes local_4;
  
  dictSize = *(uint *)((long)pp + 0xac);
  if (*size < 5) {
    local_4 = 5;
  }
  else {
    *size = 5;
    *props = ((char)*(undefined4 *)((long)pp + 0x68) * '\x05' +
             (char)*(undefined4 *)((long)pp + 100)) * '\t' + (char)*(undefined4 *)((long)pp + 0x60);
    if (dictSize < 0x400000) {
      for (i = 0xb; i < 0x1f; i = i + 1) {
        bVar1 = (byte)i;
        if (dictSize <= (uint)(2 << (bVar1 & 0x1f))) {
          dictSize = 2 << (bVar1 & 0x1f);
          break;
        }
        if (dictSize <= (uint)(3 << (bVar1 & 0x1f))) {
          dictSize = 3 << (bVar1 & 0x1f);
          break;
        }
      }
    }
    else if (dictSize < 0xfff00000) {
      dictSize = dictSize + 0xfffff & 0xfff00000;
    }
    for (i = 0; i < 4; i = i + 1) {
      props[i + 1] = (Byte)(dictSize >> ((byte)(i << 3) & 0x1f));
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_WriteProperties(CLzmaEncHandle pp, Byte *props, SizeT *size)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  unsigned i;
  UInt32 dictSize = p->dictSize;
  if (*size < LZMA_PROPS_SIZE)
    return SZ_ERROR_PARAM;
  *size = LZMA_PROPS_SIZE;
  props[0] = (Byte)((p->pb * 5 + p->lp) * 9 + p->lc);

  if (dictSize >= ((UInt32)1 << 22))
  {
    UInt32 kDictMask = ((UInt32)1 << 20) - 1;
    if (dictSize < (UInt32)0xFFFFFFFF - kDictMask)
      dictSize = (dictSize + kDictMask) & ~kDictMask;
  }
  else for (i = 11; i <= 30; i++)
  {
    if (dictSize <= ((UInt32)2 << i)) { dictSize = (2 << i); break; }
    if (dictSize <= ((UInt32)3 << i)) { dictSize = (3 << i); break; }
  }

  for (i = 0; i < 4; i++)
    props[1 + i] = (Byte)(dictSize >> (8 * i));
  return SZ_OK;
}